

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLScanner.cpp
# Opt level: O2

void __thiscall xercesc_4_0::XMLScanner::scanXMLDecl(XMLScanner *this,DeclTypes type)

{
  XMLBufferMgr *this_00;
  uint uVar1;
  XMLCh *pXVar2;
  XMLBuffer *toFill;
  XMLReader *pXVar3;
  XMLDocumentHandler *pXVar4;
  DocTypeHandler *pDVar5;
  bool bVar6;
  DeclTypes DVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  XMLCh XVar11;
  XMLBuffer *toFill_00;
  XMLSize_t XVar12;
  long lVar13;
  uint uVar14;
  uint uVar15;
  Codes CVar16;
  long lStack_f0;
  bool skippedSomething;
  DeclTypes local_d4;
  ReaderMgr *local_d0;
  XMLBufBid bbEncoding;
  uint local_b8 [6];
  ulong local_a0;
  XMLBufBid bbVersion;
  XMLBufBid bbStand;
  XMLBufBid bbDummy;
  XMLBufBid bbName;
  XMLBuffer *buffers [4];
  
  this_00 = &this->fBufMgr;
  bbVersion.fBuffer = XMLBufferMgr::bidOnBuffer(this_00);
  bbVersion.fMgr = this_00;
  bbEncoding.fBuffer = XMLBufferMgr::bidOnBuffer(this_00);
  bbEncoding.fMgr = this_00;
  bbStand.fBuffer = XMLBufferMgr::bidOnBuffer(this_00);
  local_d4 = type;
  bbStand.fMgr = this_00;
  bbDummy.fBuffer = XMLBufferMgr::bidOnBuffer(this_00);
  bbDummy.fMgr = this_00;
  toFill_00 = XMLBufferMgr::bidOnBuffer(this_00);
  local_b8[0] = 0xffffffff;
  local_b8[1] = -1;
  local_b8[2] = -1;
  local_b8[3] = 0xffffffff;
  buffers[0] = bbVersion.fBuffer;
  buffers[1] = bbEncoding.fBuffer;
  buffers[2] = bbStand.fBuffer;
  buffers[3] = bbDummy.fBuffer;
  local_d0 = &this->fReaderMgr;
  local_a0 = 0;
  bbName.fBuffer = toFill_00;
  bbName.fMgr = this_00;
LAB_002c234f:
  ReaderMgr::skipPastSpaces(local_d0,&skippedSomething,true);
  XVar11 = ReaderMgr::peekNextChar(local_d0);
  DVar7 = local_d4;
  if (XVar11 != L'?') {
    if ((int)local_a0 != 0 && skippedSomething == false) {
      emitError(this,ExpectedWhitespace);
    }
    XVar12 = scanUpToWSOr(this,toFill_00,L'=');
    if (XVar12 == 0) {
      emitError(this,ExpectedDeclString);
    }
    pXVar2 = toFill_00->fBuffer;
    pXVar2[toFill_00->fIndex] = L'\0';
    bVar8 = XMLString::equals(pXVar2,(XMLCh *)XMLUni::fgVersionString);
    lStack_f0 = 0;
    bVar6 = false;
    bVar9 = false;
    if (bVar8) {
LAB_002c242c:
      if (local_b8[lStack_f0] == 0xffffffff) {
        uVar14 = (int)local_a0 + 1;
        local_a0 = (ulong)uVar14;
        local_b8[lStack_f0] = uVar14;
      }
      else {
        pXVar2 = toFill_00->fBuffer;
        pXVar2[toFill_00->fIndex] = L'\0';
        emitError(this,DeclStringRep,pXVar2,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
      }
    }
    else {
      pXVar2 = toFill_00->fBuffer;
      pXVar2[toFill_00->fIndex] = L'\0';
      bVar9 = XMLString::equals(pXVar2,(XMLCh *)XMLUni::fgEncodingString);
      if (bVar9) {
        bVar9 = true;
        bVar6 = false;
        lStack_f0 = 1;
        goto LAB_002c242c;
      }
      pXVar2 = toFill_00->fBuffer;
      pXVar2[toFill_00->fIndex] = L'\0';
      bVar9 = XMLString::equals(pXVar2,(XMLCh *)XMLUni::fgStandaloneString);
      if (bVar9) {
        bVar6 = true;
        bVar9 = false;
        lStack_f0 = 2;
        goto LAB_002c242c;
      }
      pXVar2 = toFill_00->fBuffer;
      pXVar2[toFill_00->fIndex] = L'\0';
      bVar6 = false;
      emitError(this,ExpectedDeclString,pXVar2,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
      lStack_f0 = 3;
      bVar9 = false;
    }
    bVar10 = scanEq(this,true);
    if (!bVar10) {
      emitError(this,ExpectedEqSign);
    }
    toFill = buffers[lStack_f0];
    bVar10 = getQuotedString(this,toFill);
    if (!bVar10) {
      emitError(this,ExpectedQuotedString);
      ReaderMgr::skipPastChar(local_d0,L'>');
      goto LAB_002c28b7;
    }
    pXVar2 = toFill->fBuffer;
    pXVar2[toFill->fIndex] = L'\0';
    if (bVar8) {
      bVar9 = XMLString::equals(pXVar2,L"1.1");
      if (bVar9) {
        if (local_d4 == Decl_XML) {
          this->fXMLVersion = XMLV1_1;
          (this->fReaderMgr).fXMLVersion = XMLV1_1;
          pXVar3 = (this->fReaderMgr).fCurReader;
          pXVar3->fXMLVersion = XMLV1_1;
          pXVar3->fNEL = true;
          pXVar3->fgCharCharsTable = &XMLChar1_1::fgCharCharsTable1_1;
        }
        else {
          CVar16 = UnsupportedXMLVersion;
          if (this->fXMLVersion != XMLV1_1) goto LAB_002c2625;
        }
      }
      else {
        bVar9 = XMLString::equals(pXVar2,L"1.0");
        if (!bVar9) {
          bVar9 = XMLString::startsWith(pXVar2,L"1.");
          CVar16 = UnsupportedXMLVersion;
          if (!bVar9) goto LAB_002c2625;
        }
        if (local_d4 == Decl_XML) {
          this->fXMLVersion = XMLV1_0;
          (this->fReaderMgr).fXMLVersion = XMLV1_0;
          pXVar3 = (this->fReaderMgr).fCurReader;
          pXVar3->fXMLVersion = XMLV1_0;
          pXVar3->fNEL = (bool)XMLChar1_0::enableNEL;
          pXVar3->fgCharCharsTable = &XMLChar1_0::fgCharCharsTable1_0;
        }
      }
    }
    else if (bVar9) {
      bVar9 = XMLString::isValidEncName(pXVar2);
      CVar16 = BadXMLEncoding;
      if (!bVar9) {
LAB_002c2625:
        emitError(this,CVar16,pXVar2,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
      }
    }
    else if (bVar6) {
      bVar9 = XMLString::equals(pXVar2,L"yes");
      if (bVar9) {
LAB_002c2600:
        this->fStandalone = true;
        goto LAB_002c234f;
      }
      bVar9 = XMLString::equals(pXVar2,L"no");
      if (!bVar9) {
        emitError(this,BadStandalone);
        if (toFill->fIndex != 2) {
          if ((((toFill->fIndex == 3) && ((XMLCh)(*pXVar2 | 0x20U) == 0x79)) &&
              ((XMLCh)(pXVar2[1] | 0x20U) == 0x65)) && ((XMLCh)(pXVar2[2] | 0x20U) == 0x73))
          goto LAB_002c2600;
          goto LAB_002c234f;
        }
        if (((XMLCh)(*pXVar2 | 0x20U) != 0x6e) || ((XMLCh)(pXVar2[1] | 0x20U) != 0x6f))
        goto LAB_002c234f;
      }
      this->fStandalone = false;
    }
    goto LAB_002c234f;
  }
  uVar14 = 0;
  for (lVar13 = 0; lVar13 != 2; lVar13 = lVar13 + 1) {
    uVar1 = local_b8[lVar13];
    if ((uVar1 != 0xffffffff) && (uVar15 = uVar14 + 1, uVar14 = uVar1, uVar1 != uVar15)) {
      emitError(this,DeclStringsInWrongOrder);
      break;
    }
  }
  if ((DVar7 != Decl_XML) || (CVar16 = XMLVersionRequired, local_b8[0] != 0xffffffff)) {
    if (DVar7 != Decl_Text) goto LAB_002c277f;
    if (local_b8[2] != -1) {
      emitError(this,StandaloneNotLegal);
    }
    if (local_b8[1] != -1) goto LAB_002c277f;
    CVar16 = EncodingRequired;
  }
  emitError(this,CVar16);
LAB_002c277f:
  bVar9 = ReaderMgr::skippedChar(local_d0,L'?');
  if ((!bVar9) || (bVar9 = ReaderMgr::skippedChar(local_d0,L'>'), !bVar9)) {
    emitError(this,UnterminatedXMLDecl);
    ReaderMgr::skipPastChar(local_d0,L'>');
  }
  ReaderMgr::getCurrentEncodingStr(local_d0);
  if (local_b8[1] != -1) {
    pXVar3 = (this->fReaderMgr).fCurReader;
    pXVar2 = (bbEncoding.fBuffer)->fBuffer;
    pXVar2[(bbEncoding.fBuffer)->fIndex] = L'\0';
    bVar9 = XMLReader::setEncoding(pXVar3,pXVar2);
    pXVar2 = (bbEncoding.fBuffer)->fBuffer;
    pXVar2[(bbEncoding.fBuffer)->fIndex] = L'\0';
    if (!bVar9) {
      emitError(this,ContradictoryEncoding,pXVar2,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
    }
  }
  if (DVar7 == Decl_XML) {
    pXVar4 = this->fDocHandler;
    if (pXVar4 != (XMLDocumentHandler *)0x0) {
      (bbVersion.fBuffer)->fBuffer[(bbVersion.fBuffer)->fIndex] = L'\0';
      (bbEncoding.fBuffer)->fBuffer[(bbEncoding.fBuffer)->fIndex] = L'\0';
      (bbStand.fBuffer)->fBuffer[(bbStand.fBuffer)->fIndex] = L'\0';
      (*pXVar4->_vptr_XMLDocumentHandler[0xd])();
    }
  }
  else if ((DVar7 == Decl_Text) && (pDVar5 = this->fDocTypeHandler, pDVar5 != (DocTypeHandler *)0x0)
          ) {
    (bbVersion.fBuffer)->fBuffer[(bbVersion.fBuffer)->fIndex] = L'\0';
    (bbEncoding.fBuffer)->fBuffer[(bbEncoding.fBuffer)->fIndex] = L'\0';
    (*pDVar5->_vptr_DocTypeHandler[0x11])();
  }
LAB_002c28b7:
  XMLBufBid::~XMLBufBid(&bbName);
  XMLBufBid::~XMLBufBid(&bbDummy);
  XMLBufBid::~XMLBufBid(&bbStand);
  XMLBufBid::~XMLBufBid(&bbEncoding);
  XMLBufBid::~XMLBufBid(&bbVersion);
  return;
}

Assistant:

void XMLScanner::scanXMLDecl(const DeclTypes type)
{
    // Get us some buffers to use
    XMLBufBid bbVersion(&fBufMgr);
    XMLBufBid bbEncoding(&fBufMgr);
    XMLBufBid bbStand(&fBufMgr);
    XMLBufBid bbDummy(&fBufMgr);
    XMLBufBid bbName(&fBufMgr);

    //  We use this little enum and array to keep up with what we found
    //  and what order we found them in. This lets us get them free form
    //  without too much overhead, but still know that they were in the
    //  wrong order.
    enum Strings
    {
        VersionString
        , EncodingString
        , StandaloneString
        , UnknownString

        , StringCount
    };
    int flags[StringCount] = { -1, -1, -1, -1 };

    //  Also set up a list of buffers in the right order so that we know
    //  where to put stuff.
    XMLBuffer* buffers[StringCount] ;
    buffers[0] = &bbVersion.getBuffer();
    buffers[1] = &bbEncoding.getBuffer();
    buffers[2] = &bbStand.getBuffer();
    buffers[3] = &bbDummy.getBuffer();

    int curCount = 0;
    Strings curString;
    XMLBuffer& nameBuf = bbName.getBuffer();
    while (true)
    {
        // Skip any spaces
        bool skippedSomething;
        fReaderMgr.skipPastSpaces(skippedSomething, true);

        // If we are looking at a question mark, then break out
        if (fReaderMgr.lookingAtChar(chQuestion))
            break;

        // If this is not the first string, then we require the spaces
        if (!skippedSomething && curCount)
            emitError(XMLErrs::ExpectedWhitespace);

        //  Get characters up to the next whitespace or equal's sign.
        if (!scanUpToWSOr(nameBuf, chEqual))
            emitError(XMLErrs::ExpectedDeclString);

        // See if it matches any of our expected strings
        if (XMLString::equals(nameBuf.getRawBuffer(), XMLUni::fgVersionString))
            curString = VersionString;
        else if (XMLString::equals(nameBuf.getRawBuffer(), XMLUni::fgEncodingString))
            curString = EncodingString;
        else if (XMLString::equals(nameBuf.getRawBuffer(), XMLUni::fgStandaloneString))
            curString = StandaloneString;
        else
            curString = UnknownString;

        //  If its an unknown string, then give that error. Else check to
        //  see if this one has been done already and give that error.
        if (curString == UnknownString)
            emitError(XMLErrs::ExpectedDeclString, nameBuf.getRawBuffer());
        else if (flags[curString] != -1)
            emitError(XMLErrs::DeclStringRep, nameBuf.getRawBuffer());
        else if (flags[curString] == -1)
            flags[curString] = ++curCount;

        //  Scan for an equal's sign. If we don't find it, issue an error
        //  but keep trying to go on.
        if (!scanEq(true))
            emitError(XMLErrs::ExpectedEqSign);

        //  Get a quote string into the buffer for the string that we are
        //  currently working on.
        if (!getQuotedString(*buffers[curString]))
        {
            emitError(XMLErrs::ExpectedQuotedString);
            fReaderMgr.skipPastChar(chCloseAngle);
            return;
        }

        // And validate the value according which one it was
        const XMLCh* rawValue = buffers[curString]->getRawBuffer();
        if (curString == VersionString)
        {
            if (XMLString::equals(rawValue, XMLUni::fgVersion1_1)) {
                if (type == Decl_XML) {
                    fXMLVersion = XMLReader::XMLV1_1;
                    fReaderMgr.setXMLVersion(XMLReader::XMLV1_1);
                }
                else {
                    if (fXMLVersion != XMLReader::XMLV1_1)
                        emitError(XMLErrs::UnsupportedXMLVersion, rawValue);
                }
            }
            else if (XMLString::equals(rawValue, XMLUni::fgVersion1_0)) {
                if (type == Decl_XML) {
                    fXMLVersion = XMLReader::XMLV1_0;
                    fReaderMgr.setXMLVersion(XMLReader::XMLV1_0);
                }
            }
            else if (XMLString::startsWith(rawValue, XMLUni::fgVersion1)) {
                if (type == Decl_XML) {
                    fXMLVersion = XMLReader::XMLV1_0;
                    fReaderMgr.setXMLVersion(XMLReader::XMLV1_0);
                }
            }
            else
                emitError(XMLErrs::UnsupportedXMLVersion, rawValue);
        }
         else if (curString == EncodingString)
        {
            if (!XMLString::isValidEncName(rawValue))
                emitError(XMLErrs::BadXMLEncoding, rawValue);
        }
         else if (curString == StandaloneString)
        {
            if (XMLString::equals(rawValue, XMLUni::fgYesString))
                fStandalone = true;
            else if (XMLString::equals(rawValue, XMLUni::fgNoString))
                fStandalone = false;
            else
            {
                emitError(XMLErrs::BadStandalone);
                //if (!XMLString::compareIString(rawValue, XMLUni::fgYesString))
                //else if (!XMLString::compareIString(rawValue, XMLUni::fgNoString))
                if (buffers[curString]->getLen() == 3 &&
                    (((rawValue[0] == chLatin_y) || (rawValue[0] == chLatin_Y)) &&
                     ((rawValue[1] == chLatin_e) || (rawValue[1] == chLatin_E)) &&
                     ((rawValue[2] == chLatin_s) || (rawValue[2] == chLatin_S))))
                    fStandalone = true;
                else if (buffers[curString]->getLen() == 2 &&
                    (((rawValue[0] == chLatin_n) || (rawValue[0] == chLatin_N)) &&
                     ((rawValue[1] == chLatin_o) || (rawValue[1] == chLatin_O))))
                    fStandalone = false;
            }
        }
    }

    //  Make sure that the strings present are in order. We don't care about
    //  which ones are present at this point, just that any there are in the
    //  right order.
    int curTop = 0;
    for (int index = VersionString; index < StandaloneString; index++)
    {
        if (flags[index] != -1)
        {
            if (flags[index] !=  curTop + 1)
            {
                emitError(XMLErrs::DeclStringsInWrongOrder);
                break;
            }
            curTop = flags[index];
        }
    }

    //  If its an XML decl, the version must be present.
    //  If its a Text decl, then encoding must be present AND standalone must not be present.
    if ((type == Decl_XML) && (flags[VersionString] == -1))
        emitError(XMLErrs::XMLVersionRequired);
    else if (type == Decl_Text) {
        if (flags[StandaloneString] != -1)
            emitError(XMLErrs::StandaloneNotLegal);
        if (flags[EncodingString] == -1)
            emitError(XMLErrs::EncodingRequired);
    }

    if (!fReaderMgr.skippedChar(chQuestion))
    {
        emitError(XMLErrs::UnterminatedXMLDecl);
        fReaderMgr.skipPastChar(chCloseAngle);
    }
     else if (!fReaderMgr.skippedChar(chCloseAngle))
    {
        emitError(XMLErrs::UnterminatedXMLDecl);
        fReaderMgr.skipPastChar(chCloseAngle);
    }

    //  Do this before we possibly update the reader with the
    //  actual encoding string. Otherwise, we will pass the wrong thing
    //  for the last parameter!
    const XMLCh* actualEnc = fReaderMgr.getCurrentEncodingStr();

    //  Ok, we've now seen the real encoding string, if there was one, so
    //  lets call back on the current reader and tell it what the real
    //  encoding string was. If it fails, that's because it represents some
    //  sort of contradiction with the autosensed format, and it keeps the
    //  original encoding.
    //
    //  NOTE: This can fail for a number of reasons, such as a bogus encoding
    //  name or because its in flagrant contradiction of the auto-sensed
    //  format.
    if (flags[EncodingString] != -1)
    {
        if (!fReaderMgr.getCurrentReader()->setEncoding(bbEncoding.getRawBuffer()))
            emitError(XMLErrs::ContradictoryEncoding, bbEncoding.getRawBuffer());
        else
            actualEnc = bbEncoding.getRawBuffer();
    }

    //  If we have a document handler then call the XML Decl callback.
    if (type == Decl_XML)
    {
        if (fDocHandler)
            fDocHandler->XMLDecl
            (
                bbVersion.getRawBuffer()
                , bbEncoding.getRawBuffer()
                , bbStand.getRawBuffer()
                , actualEnc
            );
    }
    else if (type == Decl_Text)
    {
        if (fDocTypeHandler)
            fDocTypeHandler->TextDecl
            (
                bbVersion.getRawBuffer()
                , bbEncoding.getRawBuffer()
            );
    }
}